

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rsi.c
# Opt level: O1

ErrorNumber test_func_rsi(TA_History *history)

{
  TA_RetCode TVar1;
  ErrorNumber EVar2;
  TA_FuncUnstId TVar3;
  char *name;
  ulong uVar4;
  ulong uVar5;
  TA_Test_conflict12 *pTVar6;
  TA_Integer outNbElement;
  TA_Integer outBegIdx;
  TA_FuncHandle *funcHandle;
  TA_RangeTestParam_conflict15 testParam;
  TA_FuncInfo *funcInfo;
  uint local_60;
  uint local_5c;
  TA_ParamHolder *local_58;
  TA_FuncHandle *local_50;
  TA_Test_conflict12 *local_48;
  TA_Real *local_40;
  TA_FuncInfo *local_38;
  
  TA_SetUnstablePeriod(TA_FUNC_UNST_ALL,0);
  pTVar6 = tableTest;
  uVar5 = 0;
  do {
    if ((int)history->nbBars < pTVar6->expectedNbElement) {
      printf("%s Failed Bad Parameter for Test #%d (%d,%d)\n",
             "/workspace/llm4binary/github/license_c_cmakelists/TA-Lib[P]ta-lib/src/tools/ta_regtest/ta_test_func/test_rsi.c"
             ,uVar5 & 0xffffffff);
      return TA_TESTUTIL_TFRR_BAD_PARAM;
    }
    clearAllBuffers();
    TA_SetCompatibility(pTVar6->compatibility);
    setInputBuffer(0,history->close,history->nbBars);
    setInputBuffer(1,history->close,history->nbBars);
    if (pTVar6->theFunction == TA_ANY_MA_TEST) {
      TVar3 = TA_FUNC_UNST_RSI;
LAB_0011ab62:
      TVar1 = TA_SetUnstablePeriod(TVar3,pTVar6->unstablePeriod);
      uVar4 = 0x8a;
      if (TVar1 == TA_SUCCESS) goto LAB_0011ab79;
    }
    else {
      if (pTVar6->theFunction == TA_AD_TEST) {
        TVar3 = TA_FUNC_UNST_CMO;
        goto LAB_0011ab62;
      }
LAB_0011ab79:
      if (pTVar6->theFunction == TA_AD_TEST) {
        TVar1 = TA_CMO(pTVar6->startIdx,pTVar6->endIdx,gBuffer[0].in,pTVar6->optInTimePeriod,
                       (int *)&local_5c,(int *)&local_60,gBuffer[0].out0);
      }
      else {
        TVar1 = 0x143a;
        if (pTVar6->theFunction == TA_ANY_MA_TEST) {
          TVar1 = TA_RSI(pTVar6->startIdx,pTVar6->endIdx,gBuffer[0].in,pTVar6->optInTimePeriod,
                         (int *)&local_5c,(int *)&local_60,gBuffer[0].out0);
        }
      }
      EVar2 = checkDataSame(gBuffer[0].in,history->close,history->nbBars);
      if (EVar2 == TA_TEST_PASS) {
        EVar2 = checkExpectedValue(gBuffer[0].out0,TVar1,pTVar6->expectedRetCode,local_5c,
                                   pTVar6->expectedBegIdx,local_60,pTVar6->expectedNbElement,
                                   pTVar6->oneOfTheExpectedOutReal0,
                                   pTVar6->oneOfTheExpectedOutRealIndex0);
        if (EVar2 == TA_TEST_PASS) {
          local_60 = 0;
          local_5c = 0;
          if (pTVar6->theFunction == TA_AD_TEST) {
            TVar1 = TA_CMO(pTVar6->startIdx,pTVar6->endIdx,gBuffer[1].in,pTVar6->optInTimePeriod,
                           (int *)&local_5c,(int *)&local_60,gBuffer[1].in);
          }
          else {
            TVar1 = 0x143b;
            if (pTVar6->theFunction == TA_ANY_MA_TEST) {
              TVar1 = TA_RSI(pTVar6->startIdx,pTVar6->endIdx,gBuffer[1].in,pTVar6->optInTimePeriod,
                             (int *)&local_5c,(int *)&local_60,gBuffer[1].in);
            }
          }
          EVar2 = checkSameContent(gBuffer[0].out0,gBuffer[1].in);
          if (EVar2 != TA_TEST_PASS) goto LAB_0011abf2;
          EVar2 = checkExpectedValue(gBuffer[1].in,TVar1,pTVar6->expectedRetCode,local_5c,
                                     pTVar6->expectedBegIdx,local_60,pTVar6->expectedNbElement,
                                     pTVar6->oneOfTheExpectedOutReal0,
                                     pTVar6->oneOfTheExpectedOutRealIndex0);
          if (EVar2 != TA_TEST_PASS) goto LAB_0011ac2d;
          name = "RSI";
          if (pTVar6->theFunction == TA_ANY_MA_TEST) {
LAB_0011ad38:
            TVar1 = TA_GetFuncHandle(name,&local_50);
          }
          else {
            TVar1 = 0x143c;
            if (pTVar6->theFunction == TA_AD_TEST) {
              name = "CMO";
              goto LAB_0011ad38;
            }
          }
          if (TVar1 == TA_SUCCESS) {
            TVar1 = TA_GetFuncInfo(local_50,&local_38);
            if (TVar1 == TA_SUCCESS) {
              TVar1 = TA_ParamHolderAlloc(local_50,&local_58);
              if (TVar1 == TA_SUCCESS) {
                TVar1 = TA_SetInputParamRealPtr(local_58,0,gBuffer[0].in);
                if (TVar1 == TA_SUCCESS) {
                  TVar1 = TA_SetOptInputParamInteger(local_58,0,pTVar6->optInTimePeriod);
                  if (TVar1 == TA_SUCCESS) {
                    TVar1 = TA_SetOutputParamRealPtr(local_58,0,gBuffer[1].out0);
                    if (TVar1 == TA_SUCCESS) {
                      TVar1 = TA_CallFunc(local_58,pTVar6->startIdx,pTVar6->endIdx,
                                          (TA_Integer *)&local_5c,(TA_Integer *)&local_60);
                      if (TVar1 == TA_SUCCESS) {
                        TVar1 = TA_ParamHolderFree(local_58);
                        if (TVar1 == TA_SUCCESS) {
                          EVar2 = checkSameContent(gBuffer[0].out0,gBuffer[1].out0);
                          if (EVar2 != TA_TEST_PASS) goto LAB_0011abf2;
                          EVar2 = checkExpectedValue(gBuffer[1].out0,TA_SUCCESS,
                                                     pTVar6->expectedRetCode,local_5c,
                                                     pTVar6->expectedBegIdx,local_60,
                                                     pTVar6->expectedNbElement,
                                                     pTVar6->oneOfTheExpectedOutReal0,
                                                     pTVar6->oneOfTheExpectedOutRealIndex0);
                          if (EVar2 != TA_TEST_PASS) goto LAB_0011ac2d;
                          local_40 = history->close;
                          local_48 = pTVar6;
                          if (pTVar6->doRangeTestFlag != 0) {
                            if (pTVar6->theFunction == TA_ANY_MA_TEST) {
                              TVar3 = TA_FUNC_UNST_RSI;
LAB_0011af30:
                              EVar2 = doRangeTest(rangeTestFunction,TVar3,&local_48,1,0);
                              uVar4 = (ulong)EVar2;
                            }
                            else {
                              uVar4 = 0;
                              if (pTVar6->theFunction == TA_AD_TEST) {
                                TVar3 = TA_FUNC_UNST_CMO;
                                goto LAB_0011af30;
                              }
                            }
                            if ((int)uVar4 != 0) goto LAB_0011ac40;
                          }
                          uVar4 = 0;
                        }
                        else {
                          printf("Fail: TA_GetFuncHandle with retCode = %d\n");
                          uVar4 = 0x25b;
                        }
                      }
                      else {
                        printf("Fail: TA_CallFunc with retCode = %d\n");
                        uVar4 = 0x25f;
                      }
                    }
                    else {
                      printf("Fail: TA_SetOutputParamRealPtr with retCode = %d\n");
                      uVar4 = 0x25e;
                    }
                  }
                  else {
                    printf("Fail: TA_SetOptInputParamInteger with retCode = %d\n");
                    uVar4 = 0x25d;
                  }
                }
                else {
                  printf("Fail: TA_SetInputParamRealPtr with retCode = %d\n");
                  uVar4 = 0x25c;
                }
              }
              else {
                printf("Fail: TA_ParamHolderAlloc with retCode = %d\n");
                uVar4 = 0x25a;
              }
            }
            else {
              printf("Fail: TA_GetFuncInfo with retCode = %d\n");
              uVar4 = 0x259;
            }
          }
          else {
            printf("Fail: TA_GetFuncHandle with retCode = %d\n");
            uVar4 = 600;
          }
        }
        else {
LAB_0011ac2d:
          uVar4 = (ulong)EVar2;
          printf("Fail for output id=%d\n");
        }
      }
      else {
LAB_0011abf2:
        uVar4 = (ulong)EVar2;
      }
    }
LAB_0011ac40:
    if ((ErrorNumber)uVar4 != TA_TEST_PASS) {
      printf("%s Failed Test #%d (Code=%d)\n",
             "/workspace/llm4binary/github/license_c_cmakelists/TA-Lib[P]ta-lib/src/tools/ta_regtest/ta_test_func/test_rsi.c"
             ,uVar5 & 0xffffffff,uVar4);
      return (ErrorNumber)uVar4;
    }
    uVar5 = uVar5 + 1;
    pTVar6 = pTVar6 + 1;
    if (uVar5 == 0x29) {
      TA_SetUnstablePeriod(TA_FUNC_UNST_ALL,0);
      return TA_TEST_PASS;
    }
  } while( true );
}

Assistant:

ErrorNumber test_func_rsi( TA_History *history )
{
   unsigned int i;
   ErrorNumber retValue;

   /* Re-initialize all the unstable period to zero. */
   TA_SetUnstablePeriod( TA_FUNC_UNST_ALL, 0 );

   for( i=0; i < NB_TEST; i++ )
   {
      if( (int)tableTest[i].expectedNbElement > (int)history->nbBars )
      {
         printf( "%s Failed Bad Parameter for Test #%d (%d,%d)\n", __FILE__,
                 i, tableTest[i].expectedNbElement, history->nbBars );
         return TA_TESTUTIL_TFRR_BAD_PARAM;
      }

      retValue = do_test( history, &tableTest[i] );
      if( retValue != 0 )
      {
         printf( "%s Failed Test #%d (Code=%d)\n", __FILE__,
                 i, retValue );
         return retValue;
      }
   }

   /* Re-initialize all the unstable period to zero. */
   TA_SetUnstablePeriod( TA_FUNC_UNST_ALL, 0 );

   /* All test succeed. */
   return TA_TEST_PASS;
}